

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::ShaderAtomicAndCase::getInputs
          (ShaderAtomicAndCase *this,int numValues,int stride,void *inputs)

{
  Precision PVar1;
  uint uVar2;
  deUint32 dVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  Random rnd;
  deRandom local_40;
  
  dVar3 = deStringHash((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar3);
  PVar1 = (this->super_ShaderAtomicOpCase).m_precision;
  iVar6 = 0x20;
  if (PVar1 != PRECISION_HIGHP) {
    iVar6 = (uint)(PVar1 == PRECISION_MEDIUMP) * 8 + 8;
  }
  uVar8 = ~(-1 << ((byte)iVar6 & 0x1f));
  if (PVar1 == PRECISION_HIGHP) {
    uVar8 = 0xffffffff;
  }
  iVar7 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1];
  uVar2 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2];
  uVar9 = iVar7 * uVar2;
  if (0 < numValues / (int)uVar9) {
    iVar11 = 0;
    iVar4 = 0;
    do {
      dVar3 = deRandom_getUint32(&local_40);
      uVar12 = (ulong)uVar9;
      iVar10 = iVar11;
      if (0 < (int)uVar9) {
        do {
          dVar5 = deRandom_getUint32(&local_40);
          *(deUint32 *)((long)inputs + (long)iVar10) =
               dVar5 & uVar8 | 1 << ((byte)(dVar3 % (iVar6 - 1U)) & 0x1f);
          iVar10 = iVar10 + stride;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      iVar4 = iVar4 + 1;
      iVar11 = iVar11 + iVar7 * uVar2 * stride;
    } while (iVar4 != numValues / (int)uVar9);
  }
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		de::Random		rnd				(deStringHash(getName()));
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;
		const deUint32	valueMask		= numBits == 32 ? ~0u : (1u<<numBits)-1u;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupMask		= 1<<rnd.getInt(0, numBits-2); // One bit is always set.

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
				*(deUint32*)((deUint8*)inputs + stride*(groupOffset+localNdx)) = (rnd.getUint32() & valueMask) | groupMask;
		}
	}